

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::and_d8(SM83 *this)

{
  u8 *puVar1;
  u8 uVar2;
  undefined8 in_RAX;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_char_&>
  fmt;
  uchar *args_6;
  undefined7 uStack_18;
  u8 value;
  
  args_6 = (uchar *)0x10cafe;
  _uStack_18 = in_RAX;
  uVar2 = GetByteFromPC(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x4a;
  value = uVar2;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_char&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  AND 0x{:02X}\n",
             fmt,&(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)&value,args_6);
  puVar1 = &(this->field_0).field_1.a;
  *puVar1 = *puVar1 & value;
  (this->field_0).field_1.f = ((*puVar1 != '\0') << 7 | (this->field_0).field_1.f & 0xf) + 0xa0;
  return;
}

Assistant:

void SM83::and_d8() {
    u8 value = GetByteFromPC();
    LTRACE("AND 0x{:02X}", value);

    a &= value;

    SetZeroFlag(a == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(true);
    SetCarryFlag(false);
}